

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitUtils.hpp
# Opt level: O0

void Lib::BitUtils::setBits<5u,6u>(uint64_t *bits,uint64_t data)

{
  uint64_t uVar1;
  long in_RSI;
  ulong *in_RDI;
  uint64_t mask;
  
  uVar1 = bitmask64<5u,6u>();
  *in_RDI = (uVar1 ^ 0xffffffffffffffff) & *in_RDI;
  *in_RDI = uVar1 & in_RSI << 5 | *in_RDI;
  return;
}

Assistant:

static void setBits(uint64_t& bits, uint64_t data) {
    auto mask = bitmask64<lower, upper>();

    // shift `data` into position
    data <<= lower;

    // mask out upper bits of `data`
    // *probably* not strictly necessary if `data` always zero at `upper` and `above`,
    // but doesn't cost us much (~2 instructions) to put this sanity check here
    data &= mask;

    // actually set the bits
    IGNORE_MAYBE_UNINITIALIZED(
    bits &= ~mask;
    )
    bits |= data;
  }